

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::saveHistorySelection(QFileDialogPrivate *this)

{
  pointer pHVar1;
  ulong uVar2;
  long lVar3;
  QModelIndex *index;
  QModelIndex *pQVar4;
  long in_FS_OFFSET;
  QPersistentModelIndex local_50;
  QArrayDataPointer<QModelIndex> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->qFileDialogUi).d != (Ui_QFileDialog *)0x0) &&
      (uVar2 = (ulong)this->currentHistoryLocation, -1 < (long)uVar2)) &&
     (uVar2 < (ulong)(this->currentHistory).d.size)) {
    pHVar1 = QList<QFileDialogPrivate::HistoryItem>::data(&this->currentHistory);
    QList<QPersistentModelIndex>::clear(&pHVar1[uVar2].selection);
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
    QItemSelectionModel::selectedRows((int)&local_48);
    pQVar4 = local_48.ptr;
    for (lVar3 = local_48.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      QPersistentModelIndex::QPersistentModelIndex(&local_50,pQVar4);
      QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>
                (&pHVar1[uVar2].selection,&local_50);
      QPersistentModelIndex::~QPersistentModelIndex(&local_50);
      pQVar4 = pQVar4 + 1;
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::saveHistorySelection()
{
    if (qFileDialogUi.isNull() || currentHistoryLocation < 0 || currentHistoryLocation >= currentHistory.size())
        return;
    auto &item = currentHistory[currentHistoryLocation];
    item.selection.clear();
    const auto selectedIndexes = qFileDialogUi->listView->selectionModel()->selectedRows();
    for (const auto &index : selectedIndexes)
        item.selection.append(QPersistentModelIndex(index));
}